

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

Index __thiscall
PlanningUnitMADPDiscrete::GetTimeStepForJOHI(PlanningUnitMADPDiscrete *this,Index johI)

{
  ulong uVar1;
  Index IVar2;
  JointObservationHistoryTree *pJVar3;
  ulong uVar4;
  
  if ((this->_m_params)._m_jointObservationHistories == true) {
    pJVar3 = GetJointObservationHistoryTree(this,johI);
    IVar2 = (Index)(((pJVar3->super_TreeNode<JointObservationHistory>)._m_containedElem)->
                   super_JointHistory).super_History._m_length;
  }
  else {
    uVar1 = (this->super_PlanningUnit)._m_horizon;
    if (uVar1 == 0) {
      IVar2 = 0xffffffff;
    }
    else {
      uVar4 = 0;
      do {
        if ((ulong)johI <
            (this->_m_firstJOHIforT).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4]) break;
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (uVar4 < uVar1);
      IVar2 = (int)uVar4 - 1;
    }
  }
  return IVar2;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetTimeStepForJOHI(Index johI) const
{
    if(_m_params.GetComputeJointObservationHistories())
        return(GetJointObservationHistoryTree(johI)->GetContainedElement()->
                GetLength() );

    //else... find out what time step this is a joh for
    Index t = 0;
    size_t h=GetHorizon();
    while(  t < h && _m_firstJOHIforT[t] <= johI )
        t++;

    //  _m_firstJOHIforT[t] > johI  OR t==GetHorizon
    if(t == h)
        t--; //last time step is h-1
    else
        t--;//_m_nrJointObservationHistoriesT[t] > johI so johI belongs to 
            //previous time step.
    return(t);
}